

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

UnitsPtr __thiscall libcellml::Model::takeUnits(Model *this,size_t index)

{
  ModelImpl *pMVar1;
  size_type sVar2;
  reference pvVar3;
  element_type *this_00;
  UnitsImpl *this_01;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  UnitsPtr UVar5;
  size_t index_local;
  Model *this_local;
  UnitsPtr *units;
  
  std::shared_ptr<libcellml::Units>::shared_ptr((shared_ptr<libcellml::Units> *)this,(nullptr_t)0x0)
  ;
  pMVar1 = pFunc((Model *)index);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ::size(&pMVar1->mUnits);
  _Var4._M_pi = extraout_RDX;
  if (in_RDX < sVar2) {
    pMVar1 = pFunc((Model *)index);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             ::at(&pMVar1->mUnits,in_RDX);
    std::shared_ptr<libcellml::Units>::operator=((shared_ptr<libcellml::Units> *)this,pvVar3);
    removeUnits((Model *)index,in_RDX);
    this_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    this_01 = Units::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_01);
    _Var4._M_pi = extraout_RDX_00;
  }
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Model::takeUnits(size_t index)
{
    UnitsPtr units = nullptr;
    if (index < pFunc()->mUnits.size()) {
        units = pFunc()->mUnits.at(index);
        removeUnits(index);
        units->pFunc()->removeParent();
    }

    return units;
}